

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bend.hpp
# Opt level: O0

RealType __thiscall OpenMD::Bend::getValue(Bend *this,int snapshotNo)

{
  undefined4 in_ESI;
  Vector<double,_3U> *in_RDI;
  double dVar1;
  Vector<double,_3U> *v2;
  double dVar2;
  RealType cosTheta;
  RealType d23;
  Vector3d r23;
  RealType d21;
  Vector3d r21;
  Vector3d pos3;
  Vector3d pos2;
  Vector3d pos1;
  Vector<double,_3U> *in_stack_ffffffffffffff30;
  Vector<double,_3U> *in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff40;
  int in_stack_ffffffffffffff44;
  StuntDouble *in_stack_ffffffffffffff48;
  Vector3d *in_stack_ffffffffffffffa8;
  Snapshot *in_stack_ffffffffffffffb0;
  
  std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::operator[]
            ((vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *)(in_RDI->data_ + 2),0);
  StuntDouble::getPos(in_stack_ffffffffffffff48,in_stack_ffffffffffffff44);
  std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::operator[]
            ((vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *)(in_RDI->data_ + 2),1);
  StuntDouble::getPos(in_stack_ffffffffffffff48,in_stack_ffffffffffffff44);
  std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::operator[]
            ((vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *)(in_RDI->data_ + 2),2);
  StuntDouble::getPos(in_stack_ffffffffffffff48,in_stack_ffffffffffffff44);
  OpenMD::operator-(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
  Vector3<double>::Vector3((Vector3<double> *)in_stack_ffffffffffffff30,in_RDI);
  (**(code **)(*(long *)in_RDI->data_[1] + 0x20))((long *)in_RDI->data_[1],in_ESI);
  Snapshot::wrapVector(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  dVar1 = Vector<double,_3U>::length((Vector<double,_3U> *)0x26832d);
  OpenMD::operator-(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
  Vector3<double>::Vector3((Vector3<double> *)in_stack_ffffffffffffff30,in_RDI);
  (**(code **)(*(long *)in_RDI->data_[1] + 0x20))((long *)in_RDI->data_[1],in_ESI);
  Snapshot::wrapVector(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  v2 = (Vector<double,_3U> *)Vector<double,_3U>::length((Vector<double,_3U> *)0x268388);
  dVar2 = dot<double,3u>((Vector<double,_3U> *)
                         CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),v2);
  dVar2 = dVar2 / (dVar1 * (double)v2);
  if (dVar2 <= 1.0) {
    if (dVar2 < -1.0) {
      dVar2 = -1.0;
    }
  }
  else {
    dVar2 = 1.0;
  }
  dVar1 = acos(dVar2);
  return dVar1;
}

Assistant:

RealType getValue(int snapshotNo) {
      Vector3d pos1 = atoms_[0]->getPos(snapshotNo);
      Vector3d pos2 = atoms_[1]->getPos(snapshotNo);
      Vector3d pos3 = atoms_[2]->getPos(snapshotNo);

      Vector3d r21 = pos1 - pos2;
      snapshotMan_->getSnapshot(snapshotNo)->wrapVector(r21);
      RealType d21 = r21.length();

      Vector3d r23 = pos3 - pos2;
      snapshotMan_->getSnapshot(snapshotNo)->wrapVector(r23);
      RealType d23 = r23.length();

      RealType cosTheta = dot(r21, r23) / (d21 * d23);

      // check roundoff
      if (cosTheta > 1.0) {
        cosTheta = 1.0;
      } else if (cosTheta < -1.0) {
        cosTheta = -1.0;
      }

      return acos(cosTheta);
    }